

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O3

Elem * new_string(Grammar *g,char *s,char *e,Rule *r)

{
  char *pcVar1;
  byte bVar2;
  byte bVar3;
  Term *pTVar4;
  ushort *puVar5;
  char cVar6;
  uint uVar7;
  Elem *pEVar8;
  ushort **ppuVar9;
  long lVar10;
  size_t sVar11;
  int __base;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  ulong uVar15;
  ulong uVar16;
  
  pEVar8 = new_term_string(g,s + 1,e + -1,r);
  *(uint *)&((pEVar8->e).nterm)->name = (uint)(*s == '\"');
  pTVar4 = (pEVar8->e).term;
  pcVar14 = pTVar4->string;
  pcVar13 = pcVar14;
  do {
    cVar6 = *pcVar13;
    if (cVar6 != '\\') {
      if (cVar6 == '\0') {
        *pcVar14 = '\0';
        pcVar14 = pTVar4->string;
        sVar11 = strlen(pcVar14);
        pTVar4->string_len = (int)sVar11;
        if ((int)sVar11 != 0) {
          return pEVar8;
        }
        d_fail("empty string after unescape \'%s\'",pcVar14);
        return pEVar8;
      }
      *pcVar14 = cVar6;
      goto LAB_00138c5e;
    }
    pcVar12 = pcVar13 + 1;
    bVar2 = pcVar13[1];
    cVar6 = '\\';
    if (bVar2 < 0x5c) {
      if (bVar2 - 0x30 < 8) {
        ppuVar9 = __ctype_b_loc();
        __base = 8;
        uVar15 = 1;
        if (((pcVar13[2] & 0xfeU) == 0x38) || (((*ppuVar9)[(byte)pcVar13[2]] & 0x800) == 0)) {
          uVar16 = 1;
        }
        else {
          uVar16 = (ulong)((pcVar13[3] & 0xfeU) == 0x38 ||
                          (*(byte *)((long)*ppuVar9 + (ulong)(byte)pcVar13[3] * 2 + 1) & 8) == 0) ^
                   3;
          uVar15 = uVar16;
        }
LAB_00138bff:
        pcVar1 = pcVar13 + uVar16;
        cVar6 = pcVar12[uVar15];
        pcVar12[uVar15] = '\0';
        lVar10 = strtol(pcVar12,(char **)0x0,__base);
        *pcVar14 = (char)lVar10;
        pcVar12[uVar15] = cVar6;
        pcVar12 = pcVar13 + uVar16;
        pcVar13 = pcVar1;
        if (*pcVar12 < '\x01') {
          d_fail("encountered an escaped NULL while processing \'%s\'",pTVar4->string);
          cVar6 = *pcVar1;
          goto switchD_00138a5d_caseD_65;
        }
      }
      else if (bVar2 == 0x22) {
        if (pTVar4->kind != TERM_REGEX) goto switchD_00138a5d_caseD_65;
        *pcVar14 = '\"';
        pcVar13 = pcVar12;
      }
      else {
        if ((bVar2 != 0x27) || (pTVar4->kind != TERM_STRING)) goto switchD_00138a5d_caseD_65;
        *pcVar14 = '\'';
        pcVar13 = pcVar12;
      }
      goto LAB_00138c5e;
    }
    switch(bVar2) {
    case 0x61:
      *pcVar14 = '\a';
      pcVar13 = pcVar12;
      break;
    case 0x62:
      *pcVar14 = '\b';
      pcVar13 = pcVar12;
      break;
    case 99:
      *pcVar14 = '\0';
      return pEVar8;
    case 100:
      ppuVar9 = __ctype_b_loc();
      puVar5 = *ppuVar9;
      bVar2 = pcVar13[2];
      if ((*(byte *)((long)puVar5 + (ulong)bVar2 * 2 + 1) & 8) != 0) {
        bVar3 = pcVar13[3];
        __base = 10;
        uVar7 = 1;
        if ((*(byte *)((long)puVar5 + (ulong)bVar3 * 2 + 1) & 8) != 0) {
          uVar7 = 2;
          if (((*(byte *)((long)puVar5 + (ulong)(byte)pcVar13[4] * 2 + 1) & 8) != 0) &&
             (((char)bVar2 < '2' ||
              ((bVar2 == 0x32 && (((char)bVar3 < '5' || (pcVar13[4] < '6' && bVar3 == 0x35)))))))) {
            uVar7 = 3;
          }
        }
LAB_00138bf9:
        pcVar12 = pcVar13 + 2;
        uVar16 = (ulong)(uVar7 + 1);
        uVar15 = (ulong)uVar7;
        goto LAB_00138bff;
      }
      goto LAB_00138c61;
    case 0x65:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x75:
    case 0x77:
switchD_00138a5d_caseD_65:
      *pcVar14 = cVar6;
      pcVar14[1] = pcVar13[1];
      pcVar14 = pcVar14 + 1;
      pcVar13 = pcVar13 + 1;
      break;
    case 0x66:
      *pcVar14 = '\f';
      pcVar13 = pcVar12;
      break;
    case 0x6e:
      *pcVar14 = '\n';
      pcVar13 = pcVar12;
      break;
    case 0x72:
      *pcVar14 = '\r';
      pcVar13 = pcVar12;
      break;
    case 0x74:
      *pcVar14 = '\t';
      pcVar13 = pcVar12;
      break;
    case 0x76:
      *pcVar14 = '\v';
      pcVar13 = pcVar12;
      break;
    case 0x78:
      ppuVar9 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar9 + (ulong)(byte)pcVar13[2] * 2 + 1) & 0x10) != 0) {
        uVar7 = 2 - ((*(byte *)((long)*ppuVar9 + (ulong)(byte)pcVar13[3] * 2 + 1) & 0x10) == 0);
        __base = 0x10;
        goto LAB_00138bf9;
      }
      goto LAB_00138c61;
    default:
      if ((bVar2 != 0x5c) || (pTVar4->kind != TERM_STRING)) goto switchD_00138a5d_caseD_65;
      *pcVar14 = '\\';
      pcVar13 = pcVar12;
    }
LAB_00138c5e:
    pcVar14 = pcVar14 + 1;
    pcVar12 = pcVar13;
LAB_00138c61:
    pcVar13 = pcVar12 + 1;
  } while( true );
}

Assistant:

Elem *new_string(Grammar *g, char *s, char *e, Rule *r) {
  Elem *x = new_term_string(g, s + 1, e - 1, r);
  x->e.term->kind = (*s == '"') ? TERM_REGEX : TERM_STRING;
  unescape_term_string(x->e.term);
  return x;
}